

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

int blake2b_update(blake2b_state *S,uint8_t *in,uint64_t inlen)

{
  uint8_t *block;
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  
  if (inlen != 0) {
    block = S->buf;
    do {
      __n = 0x100 - S->buflen;
      uVar2 = inlen - __n;
      if (inlen < __n || uVar2 == 0) {
        memcpy(block + S->buflen,in,inlen);
        S->buflen = S->buflen + inlen;
        uVar2 = 0;
      }
      else {
        memcpy(block + S->buflen,in,__n);
        S->buflen = S->buflen + __n;
        uVar1 = S->t[0];
        S->t[0] = uVar1 + 0x80;
        S->t[1] = (S->t[1] + 1) - (ulong)(uVar1 < 0xffffffffffffff80);
        blake2b_compress(S,block);
        memcpy(block,S->buf + 0x80,0x80);
        S->buflen = S->buflen - 0x80;
        inlen = __n;
      }
      in = in + inlen;
      inlen = uVar2;
    } while (uVar2 != 0);
  }
  return 0;
}

Assistant:

int blake2b_update( blake2b_state *S, const uint8_t *in, uint64_t inlen )
{
  while( inlen > 0 )
  {
    size_t left = S->buflen;
    size_t fill = 2 * BLAKE2B_BLOCKBYTES - left;

    if( inlen > fill )
    {
      memcpy( S->buf + left, in, fill ); // Fill buffer
      S->buflen += fill;
      blake2b_increment_counter( S, BLAKE2B_BLOCKBYTES );
      blake2b_compress( S, S->buf ); // Compress
      memcpy( S->buf, S->buf + BLAKE2B_BLOCKBYTES, BLAKE2B_BLOCKBYTES ); // Shift buffer left
      S->buflen -= BLAKE2B_BLOCKBYTES;
      in += fill;
      inlen -= fill;
    }
    else // inlen <= fill
    {
      memcpy( S->buf + left, in, (size_t)inlen );
      S->buflen += (size_t)inlen; // Be lazy, do not compress
      in += inlen;
      inlen -= inlen;
    }
  }

  return 0;
}